

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O3

void __thiscall
cmSourceGroup::cmSourceGroup(cmSourceGroup *this,string *name,char *regex,char *parentName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string *psVar3;
  _Rb_tree_header *p_Var4;
  pointer pcVar5;
  undefined8 uVar6;
  cmSourceGroupInternals *pcVar7;
  char *pcVar8;
  
  paVar1 = &(this->Name).field_2;
  (this->Name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar5 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar2) {
    uVar6 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->Name).field_2 + 8) = uVar6;
  }
  else {
    (this->Name)._M_dataplus._M_p = pcVar5;
    (this->Name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->Name)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  psVar3 = &this->FullName;
  (this->FullName)._M_dataplus._M_p = (pointer)&(this->FullName).field_2;
  (this->FullName)._M_string_length = 0;
  (this->FullName).field_2._M_local_buf[0] = '\0';
  (this->GroupRegex).regmatch.startp[0] = (char *)0x0;
  (this->GroupRegex).regmatch.endp[0] = (char *)0x0;
  (this->GroupRegex).regmatch.searchstring = (char *)0x0;
  (this->GroupRegex).program = (char *)0x0;
  p_Var4 = &(this->GroupFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->GroupFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GroupFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->GroupFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
  (this->GroupFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
  (this->GroupFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->SourceFiles).
  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SourceFiles).
  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SourceFiles).
  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar7 = (cmSourceGroupInternals *)operator_new(0x18);
  (pcVar7->GroupChildren).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pcVar7->GroupChildren).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pcVar7->GroupChildren).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->Internal = pcVar7;
  pcVar8 = "^$";
  if (regex != (char *)0x0) {
    pcVar8 = regex;
  }
  cmsys::RegularExpression::compile(&this->GroupRegex,pcVar8);
  if (parentName != (char *)0x0) {
    pcVar8 = (char *)(this->FullName)._M_string_length;
    strlen(parentName);
    std::__cxx11::string::_M_replace((ulong)psVar3,0,pcVar8,(ulong)parentName);
    std::__cxx11::string::append((char *)psVar3);
  }
  std::__cxx11::string::_M_append((char *)psVar3,(ulong)(this->Name)._M_dataplus._M_p);
  return;
}

Assistant:

cmSourceGroup::cmSourceGroup(std::string name, const char* regex,
                             const char* parentName)
  : Name(std::move(name))
{
  this->Internal = new cmSourceGroupInternals;
  this->SetGroupRegex(regex);
  if (parentName) {
    this->FullName = parentName;
    this->FullName += "\\";
  }
  this->FullName += this->Name;
}